

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TiledRgbaInputFile::FromYa::readTile(FromYa *this,int dx,int dy,int lx,int ly)

{
  Rgba *pRVar1;
  Rgba *pRVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ostream *poVar7;
  ArgExc *this_00;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint n;
  Box2i dw;
  undefined1 local_1b8 [392];
  
  if (this->_fbBase != (Rgba *)0x0) {
    TiledInputFile::readTile(this->_inputFile,dx,dy,lx,ly);
    TiledInputFile::dataWindowForTile((TiledInputFile *)local_1b8,(int)this->_inputFile,dx,dy,lx);
    if ((int)local_1b8._4_4_ <= (int)local_1b8._12_4_) {
      iVar4 = local_1b8._8_4_ - local_1b8._0_4_;
      n = iVar4 + 1;
      pRVar1 = this->_fbBase;
      lVar12 = 0;
      lVar10 = 0;
      lVar11 = (long)(int)local_1b8._4_4_;
      do {
        lVar5 = (this->_buf)._sizeY;
        pRVar2 = (this->_buf)._data;
        if (-1 < iVar4) {
          lVar8 = lVar5 * lVar12;
          uVar9 = 0;
          do {
            *(uint16_t *)((long)&pRVar2[uVar9].r._h + lVar8) = 0;
            *(uint16_t *)((long)&pRVar2[uVar9].b._h + lVar8) = 0;
            uVar9 = uVar9 + 1;
          } while (n != uVar9);
        }
        RgbaYca::YCAtoRGBA(&this->_yw,n,pRVar2 + lVar5 * lVar10,pRVar2 + lVar5 * lVar10);
        if ((int)local_1b8._0_4_ <= (int)local_1b8._8_4_) {
          lVar8 = 0;
          lVar5 = (long)(int)local_1b8._0_4_;
          do {
            pRVar1[this->_fbYStride * lVar11 + this->_fbXStride * lVar5] =
                 *(Rgba *)((long)&(((this->_buf)._data)->r)._h +
                          lVar8 + (this->_buf)._sizeY * lVar12);
            lVar8 = lVar8 + 8;
            bVar3 = lVar5 < (int)local_1b8._8_4_;
            lVar5 = lVar5 + 1;
          } while (bVar3);
        }
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 8;
        bVar3 = lVar11 < (int)local_1b8._12_4_;
        lVar11 = lVar11 + 1;
      } while (bVar3);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),
             "No frame buffer was specified as the pixel data destination for image file \"",0x4c);
  pcVar6 = TiledInputFile::fileName(this->_inputFile);
  poVar7 = std::operator<<((ostream *)(local_1b8 + 0x10),pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)local_1b8);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledRgbaInputFile::FromYa::readTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputFile.fileName ()
                 << "\".");
    }

    //
    // Read the tile requested by the caller into _buf.
    //

    _inputFile.readTile (dx, dy, lx, ly);

    //
    // Convert the luminance/alpha pixels to RGBA
    // and copy them into the caller's frame buffer.
    //

    Box2i    dw    = _inputFile.dataWindowForTile (dx, dy, lx, ly);
    int      width = dw.max.x - dw.min.x + 1;
    intptr_t base  = reinterpret_cast<intptr_t> (_fbBase);

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
        for (int x1 = 0; x1 < width; ++x1)
        {
            _buf[y1][x1].r = 0;
            _buf[y1][x1].b = 0;
        }

        YCAtoRGBA (_yw, width, _buf[y1], _buf[y1]);

        for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
        {
            Rgba* ptr = reinterpret_cast<Rgba*> (
                base + sizeof (Rgba) * (x * _fbXStride + y * _fbYStride));
            *ptr = _buf[y1][x1];
        }
    }
}